

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::NewScObject_Helper
          (InterpreterStackFrame *this,Var target,ArgSlot ArgCount,
          AuxArray<unsigned_int> *spreadIndices)

{
  bool bVar1;
  ThreadContext *threadContext;
  ScriptContext *pSVar2;
  Arguments local_68;
  undefined1 local_58 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var newVarInstance;
  undefined1 local_38 [8];
  Arguments args;
  AuxArray<unsigned_int> *spreadIndices_local;
  ArgSlot ArgCount_local;
  Var target_local;
  InterpreterStackFrame *this_local;
  
  args.Values = (Type)spreadIndices;
  CallInfo::CallInfo((CallInfo *)&newVarInstance,CallFlags_New,(uint)ArgCount);
  Arguments::Arguments((Arguments *)local_38,(CallInfo)newVarInstance,*(Var **)(this + 0x28));
  autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
  autoReentrancyHandler._9_7_ = 0;
  threadContext = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_58,threadContext);
  Arguments::Arguments(&local_68,(Arguments *)local_38);
  pSVar2 = GetScriptContext(this);
  autoReentrancyHandler._8_8_ =
       Js::JavascriptOperators::NewScObject
                 (target,&local_68,pSVar2,(AuxArray<unsigned_int> *)args.Values);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_58);
  PopOut(this,ArgCount);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    autoReentrancyHandler._8_8_ =
         Js::JavascriptProxy::AutoProxyWrapper((Var)autoReentrancyHandler._8_8_);
    pSVar2 = GetScriptContext(this);
    autoReentrancyHandler._8_8_ =
         CrossSite::MarshalVar(pSVar2,(Var)autoReentrancyHandler._8_8_,false);
  }
  return (Var)autoReentrancyHandler._8_8_;
}

Assistant:

Var InterpreterStackFrame::NewScObject_Helper(Var target, ArgSlot ArgCount, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = JavascriptOperators::NewScObject(target, args, GetScriptContext(), spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

            PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }